

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

QPlatformServiceColorPicker * __thiscall
QDesktopUnixServices::colorPicker(QDesktopUnixServices *this,QWindow *parent)

{
  byte bVar1;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QWindow *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  byte local_69;
  QString *local_40;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = qEnvironmentVariableIsEmpty("WAYLAND_DISPLAY");
  local_69 = 1;
  if ((bVar1 & 1) != 0) {
    QGuiApplication::platformName();
    QVar2 = Qt::Literals::StringLiterals::operator____L1
                      (in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    local_69 = QString::startsWith((QLatin1String *)local_20,(CaseSensitivity)QVar2.m_size);
    QString::~QString((QString *)0xac8102);
  }
  if ((local_69 & 1) == 0) {
    local_40 = (QString *)0x0;
  }
  else {
    local_40 = (QString *)operator_new(0x28);
    (**(code **)(*in_RDI + 0x38))(local_38,in_RDI,in_RSI);
    anon_unknown.dwarf_1d508dd::XdgDesktopPortalColorPicker::XdgDesktopPortalColorPicker
              ((XdgDesktopPortalColorPicker *)CONCAT17(local_69,in_stack_ffffffffffffff80),local_40,
               in_stack_ffffffffffffff70);
    QString::~QString((QString *)0xac8158);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPlatformServiceColorPicker *)local_40;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformServiceColorPicker *QDesktopUnixServices::colorPicker(QWindow *parent)
{
#if QT_CONFIG(dbus)
    // Make double sure that we are in a wayland environment. In particular check
    // WAYLAND_DISPLAY so also XWayland apps benefit from portal-based color picking.
    // Outside wayland we'll rather rely on other means than the XDG desktop portal.
    if (!qEnvironmentVariableIsEmpty("WAYLAND_DISPLAY")
        || QGuiApplication::platformName().startsWith("wayland"_L1)) {
        return new XdgDesktopPortalColorPicker(portalWindowIdentifier(parent), parent);
    }
    return nullptr;
#else
    Q_UNUSED(parent);
    return nullptr;
#endif
}